

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::
DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::generateDrawData
          (DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this)

{
  IndexedParamsBase *pIVar1;
  int iVar2;
  deUint32 dVar3;
  long lVar4;
  uint uVar5;
  pointer pVVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_type sVar11;
  pointer pPVar12;
  float fVar13;
  float fVar14;
  VecAccess<float,_4,_4> colorAccess;
  VecAccess<float,_4,_4> positionAccess;
  Random rnd;
  float local_a0 [2];
  float local_98 [4];
  undefined1 local_88 [8];
  pointer local_80;
  pointer pPStack_78;
  DrawIndexedIndirectParams *local_70;
  undefined1 local_68 [16];
  pointer local_58;
  float afStack_50 [4];
  deRandom local_40;
  
  pVVar6 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  deRandom_init(&local_40,pVVar6->firstIndex ^ pVVar6->indexCount ^ 0xc2a39f);
  sVar11 = 0;
  for (pVVar6 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar6 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar6 = pVVar6 + 1) {
    uVar9 = pVVar6->indexCount + pVVar6->firstIndex;
    uVar7 = (ulong)uVar9;
    if (uVar9 <= (uint)sVar11) {
      uVar7 = sVar11;
    }
    sVar11 = uVar7;
  }
  local_88 = (undefined1  [8])((ulong)(uint)local_88._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,sVar11,
             (value_type_conflict1 *)local_88,(allocator_type *)local_98);
  pIVar1 = &(this->m_data).super_IndexedParamsBase;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&pIVar1->indexes);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  local_70 = &this->m_data;
  pVVar6 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar6 == (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    sVar11 = 1;
  }
  else {
    uVar9 = 0;
    do {
      if (pVVar6->indexCount != 0) {
        uVar8 = 0;
        do {
          iVar2 = pVVar6->vertexOffset;
          dVar3 = deRandom_getUint32(&local_40);
          uVar5 = dVar3 % (0x2711U - iVar2) + iVar2;
          uVar10 = pVVar6->vertexOffset + uVar5;
          if (uVar10 <= uVar9) {
            uVar10 = uVar9;
          }
          uVar9 = uVar10;
          (pIVar1->indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[pVVar6->firstIndex + uVar8] = uVar5;
          uVar8 = uVar8 + 1;
        } while (uVar8 < pVVar6->indexCount);
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != (this->m_data).commands.
                       super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    sVar11 = (size_type)(uVar9 + 1);
  }
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_58 = (pointer)0x0;
  afStack_50[0] = 0.0;
  afStack_50[1] = 0.0;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         local_88,sVar11,(value_type *)local_68,(allocator_type *)local_98);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  _M_move_assign((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)local_70,
                 (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)local_88);
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,(long)pPStack_78 - (long)local_88);
  }
  pVVar6 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar6 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar9 = pVVar6->firstIndex;
      uVar7 = (ulong)uVar9;
      uVar8 = pVVar6->indexCount + uVar9;
      if (uVar9 < uVar8) {
        do {
          pPVar12 = (local_70->super_DrawParamsBase).vertices.
                    super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    (long)pVVar6->vertexOffset +
                    (ulong)(pIVar1->indexes).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7];
          local_68._8_4_ = FUNCTION_DRAW;
          local_68._12_4_ = FUNCTION_DRAW_INDEXED;
          local_58 = (pointer)0x300000002;
          local_68._0_8_ = pPVar12;
          fVar13 = deRandom_getFloat(&local_40);
          fVar14 = deRandom_getFloat(&local_40);
          local_88._4_4_ = fVar14 + fVar14 + -1.0;
          local_88._0_4_ = fVar13 + fVar13 + -1.0;
          local_80 = (pointer)0x3f8000003f800000;
          lVar4 = 2;
          do {
            *(float *)((long)&pPVar12->position + (long)*(int *)(local_68 + lVar4 * 4) * 4) =
                 local_98[lVar4 + 2];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 6);
          local_80 = (pointer)0x100000000;
          pPStack_78 = (pointer)0x300000002;
          local_88 = (undefined1  [8])&pPVar12->color;
          fVar13 = deRandom_getFloat(&local_40);
          local_a0[1] = deRandom_getFloat(&local_40);
          local_a0[1] = local_a0[1] + 0.0;
          local_a0[0] = deRandom_getFloat(&local_40);
          local_a0[0] = local_a0[0] + 0.0;
          fVar14 = deRandom_getFloat(&local_40);
          local_98[0] = fVar13 + 0.0;
          local_98[1] = local_a0[1];
          local_98[2] = local_a0[0];
          local_98[3] = fVar14 + 0.0;
          lVar4 = 2;
          do {
            (((pointer)&pPVar12->color)->position).m_data[*(int *)(local_88 + lVar4 * 4)] =
                 local_a0[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 6);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar8);
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != (this->m_data).commands.
                       super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void DrawTestInstance<DrawIndexedIndirectParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.commands[0].firstIndex ^ m_data.commands[0].indexCount);

	deUint32		lastIndex	= 0;

	// Get the maximum range of indexes
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index		= it->firstIndex + it->indexCount;
						lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize the vector with zeros
	m_data.indexes = std::vector<deUint32>(lastIndex, 0);

	deUint32	highestIndex	= 0;

	// Generate random indexes for the ranges
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		for (deUint32 idx = 0; idx < it->indexCount; ++idx)
		{
			const deUint32	vertexIdx	= rnd.getInt(it->vertexOffset, INDEX_LIMIT);
			const deUint32	maxIndex	= vertexIdx + it->vertexOffset;

			highestIndex = (maxIndex > highestIndex) ? maxIndex : highestIndex;
			m_data.indexes[it->firstIndex + idx] = vertexIdx;
		}
	}

	// Initialize the vertex vector
	m_data.vertices = std::vector<PositionColorVertex>(highestIndex + 1, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices in the used locations
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator cmdIt = m_data.commands.begin(); cmdIt != m_data.commands.end(); ++cmdIt)
	{
		deUint32	firstIdx	= cmdIt->firstIndex;
		deUint32	lastIdx		= firstIdx + cmdIt->indexCount;

		for (deUint32 idx = firstIdx; idx < lastIdx; ++idx)
		{
			std::vector<PositionColorVertex>::iterator	vertexIt = m_data.vertices.begin() + cmdIt->vertexOffset + m_data.indexes[idx];

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}